

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

void deqp::gles31::Functional::(anonymous_namespace)::ImageLoadAndStoreCase::
     replaceBadFloatReinterpretValues<(tcu::TextureFormat::ChannelType)34,tcu::Float<unsigned_short,5,10,15,3u>,unsigned_short>
               (LayeredImage *image,TextureFormat *imageFormat)

{
  bool bVar1;
  StorageType SVar2;
  TextureType TVar3;
  int iVar4;
  int iVar5;
  IVec3 *v;
  void *pvVar6;
  int local_9c;
  int local_98;
  Float<unsigned_short,_5,_10,_15,_3U> local_94;
  Float<unsigned_short,_5,_10,_15,_3U> local_92;
  StorageType *pSStack_90;
  Float<unsigned_short,_5,_10,_15,_3U> f;
  void *channelData;
  int c;
  void *pixelData;
  int x;
  int y;
  void *data;
  undefined1 local_60 [4];
  int rowPitch;
  PixelBufferAccess sliceAccess;
  int z;
  int numSlicesOrFaces;
  IVec3 imageSize;
  int imageNumChannels;
  int pixelSize;
  TextureFormat *imageFormat_local;
  LayeredImage *image_local;
  
  imageSize.m_data[2] = tcu::TextureFormat::getPixelSize(imageFormat);
  if (imageFormat->order == R) {
    local_98 = 1;
  }
  else {
    local_98 = 0;
    if (imageFormat->order == RGBA) {
      local_98 = 4;
    }
  }
  imageSize.m_data[1] = local_98;
  v = anon_unknown_1::LayeredImage::getSize(image);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&z,v);
  TVar3 = anon_unknown_1::LayeredImage::getImageType(image);
  if (TVar3 == TEXTURETYPE_CUBE) {
    local_9c = 6;
  }
  else {
    local_9c = tcu::Vector<int,_3>::z((Vector<int,_3> *)&z);
  }
  for (sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_ = CUBEFACE_NEGATIVE_X;
      (int)sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_ < local_9c;
      sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_ =
           sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_ + CUBEFACE_POSITIVE_X) {
    TVar3 = anon_unknown_1::LayeredImage::getImageType(image);
    if (TVar3 == TEXTURETYPE_CUBE) {
      anon_unknown_1::LayeredImage::getCubeFaceAccess
                ((PixelBufferAccess *)local_60,image,
                 sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_);
    }
    else {
      anon_unknown_1::LayeredImage::getSliceAccess
                ((PixelBufferAccess *)local_60,image,
                 sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_);
    }
    iVar4 = tcu::ConstPixelBufferAccess::getRowPitch((ConstPixelBufferAccess *)local_60);
    pvVar6 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)local_60);
    for (pixelData._4_4_ = 0; iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&z),
        pixelData._4_4_ < iVar5; pixelData._4_4_ = pixelData._4_4_ + 1) {
      for (pixelData._0_4_ = 0; iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&z),
          (int)pixelData < iVar5; pixelData._0_4_ = (int)pixelData + 1) {
        iVar5 = (int)pixelData * imageSize.m_data[2];
        for (channelData._4_4_ = 0; channelData._4_4_ < imageSize.m_data[1];
            channelData._4_4_ = channelData._4_4_ + 1) {
          pSStack_90 = (StorageType *)
                       ((long)pvVar6 +
                       (long)((channelData._4_4_ * imageSize.m_data[2]) / imageSize.m_data[1]) +
                       (long)iVar5 + (long)(pixelData._4_4_ * iVar4));
          tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_92,*pSStack_90);
          bVar1 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::isDenorm(&local_92);
          if (((bVar1) ||
              (bVar1 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::isInf(&local_92), bVar1)) ||
             (bVar1 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::isNaN(&local_92), bVar1)) {
            tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_94,0.0);
            SVar2 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(&local_94);
            *pSStack_90 = SVar2;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ImageLoadAndStoreCase::replaceBadFloatReinterpretValues (LayeredImage& image, const TextureFormat& imageFormat)
{
	// Find potential bad values, such as nan or inf, and replace with something else.
	const int		pixelSize			= imageFormat.getPixelSize();
	const int		imageNumChannels	= imageFormat.order == tcu::TextureFormat::R	? 1
										: imageFormat.order == tcu::TextureFormat::RGBA	? 4
										: 0;
	const IVec3		imageSize			= image.getSize();
	const int		numSlicesOrFaces	= image.getImageType() == TEXTURETYPE_CUBE ? 6 : imageSize.z();

	DE_ASSERT(pixelSize % imageNumChannels == 0);

	for (int z = 0; z < numSlicesOrFaces; z++)
	{
		const PixelBufferAccess		sliceAccess		= image.getImageType() == TEXTURETYPE_CUBE ? image.getCubeFaceAccess((tcu::CubeFace)z) : image.getSliceAccess(z);
		const int					rowPitch		= sliceAccess.getRowPitch();
		void *const					data			= sliceAccess.getDataPtr();

		for (int y = 0; y < imageSize.y(); y++)
		for (int x = 0; x < imageSize.x(); x++)
		{
			void *const pixelData = (deUint8*)data + y*rowPitch + x*pixelSize;

			for (int c = 0; c < imageNumChannels; c++)
			{
				void *const			channelData		= (deUint8*)pixelData + c*pixelSize/imageNumChannels;
				const TcuFloatType	f				(*(TcuFloatTypeStorageType*)channelData);

				if (f.isDenorm() || f.isInf() || f.isNaN())
					*(TcuFloatTypeStorageType*)channelData = TcuFloatType(0.0f).bits();
			}
		}
	}
}